

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# X3DExporter.cpp
# Opt level: O0

void __thiscall
Assimp::X3DExporter::Export_MetadataBoolean
          (X3DExporter *this,aiString *pKey,bool pValue,size_t pTabLevel)

{
  char *pcVar1;
  allocator<char> local_101;
  string local_100;
  undefined1 local_db;
  allocator<char> local_da;
  allocator<char> local_d9;
  value_type local_d8;
  undefined1 local_96;
  allocator<char> local_95 [20];
  allocator<char> local_81;
  value_type local_80;
  undefined1 local_40 [8];
  list<Assimp::X3DExporter::SAttribute,_std::allocator<Assimp::X3DExporter::SAttribute>_> attr_list;
  size_t pTabLevel_local;
  bool pValue_local;
  aiString *pKey_local;
  X3DExporter *this_local;
  
  attr_list.
  super__List_base<Assimp::X3DExporter::SAttribute,_std::allocator<Assimp::X3DExporter::SAttribute>_>
  ._M_impl._M_node._M_size = pTabLevel;
  std::__cxx11::
  list<Assimp::X3DExporter::SAttribute,_std::allocator<Assimp::X3DExporter::SAttribute>_>::list
            ((list<Assimp::X3DExporter::SAttribute,_std::allocator<Assimp::X3DExporter::SAttribute>_>
              *)local_40);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_80,"name",&local_81);
  local_96 = 1;
  pcVar1 = aiString::C_Str(pKey);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_80.Value,pcVar1,local_95);
  local_96 = 0;
  std::__cxx11::
  list<Assimp::X3DExporter::SAttribute,_std::allocator<Assimp::X3DExporter::SAttribute>_>::push_back
            ((list<Assimp::X3DExporter::SAttribute,_std::allocator<Assimp::X3DExporter::SAttribute>_>
              *)local_40,&local_80);
  SAttribute::~SAttribute(&local_80);
  std::allocator<char>::~allocator(local_95);
  std::allocator<char>::~allocator(&local_81);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_d8,"value",&local_d9);
  local_db = 1;
  pcVar1 = "false";
  if (pValue) {
    pcVar1 = "true";
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_d8.Value,pcVar1,&local_da);
  local_db = 0;
  std::__cxx11::
  list<Assimp::X3DExporter::SAttribute,_std::allocator<Assimp::X3DExporter::SAttribute>_>::push_back
            ((list<Assimp::X3DExporter::SAttribute,_std::allocator<Assimp::X3DExporter::SAttribute>_>
              *)local_40,&local_d8);
  SAttribute::~SAttribute(&local_d8);
  std::allocator<char>::~allocator(&local_da);
  std::allocator<char>::~allocator(&local_d9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_100,"MetadataBoolean",&local_101);
  NodeHelper_OpenNode(this,&local_100,
                      attr_list.
                      super__List_base<Assimp::X3DExporter::SAttribute,_std::allocator<Assimp::X3DExporter::SAttribute>_>
                      ._M_impl._M_node._M_size,true,
                      (list<Assimp::X3DExporter::SAttribute,_std::allocator<Assimp::X3DExporter::SAttribute>_>
                       *)local_40);
  std::__cxx11::string::~string((string *)&local_100);
  std::allocator<char>::~allocator(&local_101);
  std::__cxx11::
  list<Assimp::X3DExporter::SAttribute,_std::allocator<Assimp::X3DExporter::SAttribute>_>::~list
            ((list<Assimp::X3DExporter::SAttribute,_std::allocator<Assimp::X3DExporter::SAttribute>_>
              *)local_40);
  return;
}

Assistant:

void X3DExporter::Export_MetadataBoolean(const aiString& pKey, const bool pValue, const size_t pTabLevel)
{
list<SAttribute> attr_list;

	attr_list.push_back({"name", pKey.C_Str()});
	attr_list.push_back({"value", pValue ? "true" : "false"});
	NodeHelper_OpenNode("MetadataBoolean", pTabLevel, true, attr_list);
}